

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O3

int __thiscall Fl_Menu_Type::textstuff(Fl_Menu_Type *this,int w,Fl_Font *f,int *s,Fl_Color *c)

{
  Fl_Widget *pFVar1;
  
  if (w == 4) {
    this = (Fl_Menu_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.factory;
  }
  if ((uint)w < 5) {
    pFVar1 = (this->super_Fl_Widget_Type).o;
    switch(w) {
    default:
      *f = *(Fl_Font *)((long)&pFVar1[1].callback_ + 4);
      *s = *(int *)&pFVar1[1].user_data_;
      *c = *(Fl_Color *)((long)&pFVar1[1].user_data_ + 4);
      break;
    case 1:
      *(Fl_Font *)((long)&pFVar1[1].callback_ + 4) = *f;
      break;
    case 2:
      *(int *)&pFVar1[1].user_data_ = *s;
      break;
    case 3:
      *(Fl_Color *)((long)&pFVar1[1].user_data_ + 4) = *c;
    }
  }
  return 1;
}

Assistant:

int textstuff(int w, Fl_Font& f, int& s, Fl_Color& c) {
    Fl_Menu_ *myo = (Fl_Menu_*)(w==4 ? ((Fl_Widget_Type*)this->factory)->o : this->o);
    switch (w) {
    case 4:
    case 0: f = myo->textfont(); s = myo->textsize(); c = myo->textcolor(); break;
    case 1: myo->textfont(f); break;
    case 2: myo->textsize(s); break;
    case 3: myo->textcolor(c); break;
    }
    return 1;
  }